

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O0

void __thiscall
gvr::PointCloud::PointCloud
          (PointCloud *this,PointCloud *p,vector<bool,_std::allocator<bool>_> *vused)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  const_reference cVar4;
  bool bVar5;
  undefined1 uVar6;
  int iVar7;
  size_type sVar8;
  ulong uVar9;
  void *pvVar10;
  PointCloud *in_RSI;
  undefined8 *in_RDI;
  float fVar11;
  int i_3;
  int i_2;
  int i_1;
  int k;
  int i;
  Model *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  size_type in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff80;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_1c;
  
  Model::Model((Model *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38);
  *in_RDI = &PTR__PointCloud_001f9038;
  *(undefined4 *)(in_RDI + 0x11) = 0;
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 0;
  in_RDI[0x14] = 0;
  sVar8 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_ffffffffffffff80);
  local_1c = (int)sVar8;
  while (local_1c = local_1c + -1, -1 < local_1c) {
    cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58);
    if (cVar4) {
      *(int *)(in_RDI + 0x11) = *(int *)(in_RDI + 0x11) + 1;
    }
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(*(int *)(in_RDI + 0x11) * 3);
  uVar9 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pvVar10 = operator_new__(uVar9);
  in_RDI[0x12] = pvVar10;
  local_30 = 0;
  for (local_34 = 0; iVar7 = getVertexCount(in_RSI), local_34 < iVar7; local_34 = local_34 + 1) {
    cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58);
    if (cVar4) {
      fVar11 = getVertexComp(in_RSI,local_34,0);
      *(float *)(in_RDI[0x12] + (long)local_30 * 4) = fVar11;
      fVar11 = getVertexComp(in_RSI,local_34,1);
      iVar7 = local_30 + 2;
      *(float *)(in_RDI[0x12] + (long)(local_30 + 1) * 4) = fVar11;
      fVar11 = getVertexComp(in_RSI,local_34,2);
      local_30 = local_30 + 3;
      *(float *)(in_RDI[0x12] + (long)iVar7 * 4) = fVar11;
    }
  }
  bVar5 = hasScanProp(in_RSI);
  if (bVar5) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(*(int *)(in_RDI + 0x11) * 3);
    uVar9 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pvVar10 = operator_new__(uVar9);
    in_RDI[0x13] = pvVar10;
    local_30 = 0;
    for (local_38 = 0; iVar7 = getVertexCount(in_RSI), local_38 < iVar7; local_38 = local_38 + 1) {
      cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)
                         CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff58);
      if (cVar4) {
        fVar11 = getScanSize(in_RSI,local_38);
        *(float *)(in_RDI[0x13] + (long)local_30 * 4) = fVar11;
        fVar11 = getScanError(in_RSI,local_38);
        iVar7 = local_30 + 2;
        *(float *)(in_RDI[0x13] + (long)(local_30 + 1) * 4) = fVar11;
        fVar11 = getScanConf(in_RSI,local_38);
        local_30 = local_30 + 3;
        *(float *)(in_RDI[0x13] + (long)iVar7 * 4) = fVar11;
      }
    }
  }
  uVar6 = hasScanPos(in_RSI);
  if ((bool)uVar6) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)(*(int *)(in_RDI + 0x11) * 3);
    uVar9 = SUB168(auVar3 * ZEXT816(4),0);
    if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pvVar10 = operator_new__(uVar9);
    in_RDI[0x14] = pvVar10;
    local_30 = 0;
    for (local_3c = 0; iVar7 = getVertexCount(in_RSI), local_3c < iVar7; local_3c = local_3c + 1) {
      cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)
                         CONCAT17(uVar6,in_stack_ffffffffffffff60),(size_type)pvVar10);
      if (cVar4) {
        fVar11 = getScanPosComp(in_RSI,local_3c,0);
        *(float *)(in_RDI[0x14] + (long)local_30 * 4) = fVar11;
        fVar11 = getScanPosComp(in_RSI,local_3c,1);
        iVar7 = local_30 + 2;
        *(float *)(in_RDI[0x14] + (long)(local_30 + 1) * 4) = fVar11;
        fVar11 = getScanPosComp(in_RSI,local_3c,2);
        local_30 = local_30 + 3;
        *(float *)(in_RDI[0x14] + (long)iVar7 * 4) = fVar11;
      }
    }
  }
  return;
}

Assistant:

PointCloud::PointCloud(const PointCloud &p, const std::vector<bool> &vused) : Model(p)
{
  n=0;
  vertex=0;
  scanprop=0;
  scanpos=0;

  for (int i=static_cast<int>(vused.size())-1; i>=0; i--)
  {
    if (vused[i])
    {
      n++;
    }
  }

  vertex=new float [3*n];

  int k=0;

  for (int i=0; i<p.getVertexCount(); i++)
  {
    if (vused[i])
    {
      vertex[k++]=p.getVertexComp(i, 0);
      vertex[k++]=p.getVertexComp(i, 1);
      vertex[k++]=p.getVertexComp(i, 2);
    }
  }

  if (p.hasScanProp())
  {
    scanprop=new float [3*n];

    k=0;

    for (int i=0; i<p.getVertexCount(); i++)
    {
      if (vused[i])
      {
        scanprop[k++]=p.getScanSize(i);
        scanprop[k++]=p.getScanError(i);
        scanprop[k++]=p.getScanConf(i);
      }
    }
  }

  if (p.hasScanPos())
  {
    scanpos=new float [3*n];

    k=0;

    for (int i=0; i<p.getVertexCount(); i++)
    {
      if (vused[i])
      {
        scanpos[k++]=p.getScanPosComp(i, 0);
        scanpos[k++]=p.getScanPosComp(i, 1);
        scanpos[k++]=p.getScanPosComp(i, 2);
      }
    }
  }
}